

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FPNGChunkFile::FPNGChunkFile(FPNGChunkFile *this,FILE *file,DWORD id)

{
  (this->super_FCompressedFile).m_Pos = 0;
  (this->super_FCompressedFile).m_BufferSize = 0;
  (this->super_FCompressedFile).m_MaxBufferSize = 0;
  (this->super_FCompressedFile).m_Buffer = (uchar *)0x0;
  (this->super_FCompressedFile).m_Mode = EWriting;
  (this->super_FCompressedFile).m_File = file;
  (this->super_FCompressedFile).m_NoCompress = true;
  (this->super_FCompressedFile).super_FFile._vptr_FFile =
       (_func_int **)&PTR__FCompressedFile_007c91d8;
  this->m_ChunkID = id;
  return;
}

Assistant:

void FCompressedFile::BeEmpty ()
{
	m_Pos = 0;
	m_BufferSize = 0;
	m_MaxBufferSize = 0;
	m_Buffer = NULL;
	m_File = NULL;
	m_NoCompress = false;
	m_Mode = ENotOpen;
}